

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete.c
# Opt level: O0

void massagediscblk(Item *q1,Item *q2,Item *q3,Item *q4)

{
  Item *pIVar1;
  long in_RSI;
  Item *qs;
  Symbol *s;
  int i;
  Item *in_stack_ffffffffffffffb8;
  Item *in_stack_ffffffffffffffc0;
  Item *local_38;
  int local_24;
  
  replacstr(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  insertstr(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  insertstr(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  *(ulong *)(*(long *)(in_RSI + 8) + 8) = *(ulong *)(*(long *)(in_RSI + 8) + 8) | 0x1000;
  for (local_24 = 0x41; local_24 < 0x7b; local_24 = local_24 + 1) {
    for (local_38 = symlist[local_24]->next; local_38 != symlist[local_24];
        local_38 = local_38->next) {
      pIVar1 = (local_38->element).itm;
      if ((((pIVar1->itemtype == 0x13e) && (((ulong)(pIVar1->element).itm & 0x10) != 0)) &&
          (*(int *)&pIVar1[1].next != 0)) && (*(int *)((long)&pIVar1[1].prev + 4) != 0)) {
        if (((ulong)(pIVar1->element).itm & 0x20) == 0) {
          in_stack_ffffffffffffffb8 = (Item *)pIVar1[2].element.str;
          sprintf(buf,"{int _i; for (_i=%d; _i>0; _i--) __%s[_i] = __%s[_i-1];\n __%s[0] = %s;\n}\n"
                  ,(ulong)(*(int *)((long)&pIVar1[1].prev + 4) - 1),pIVar1[2].element.itm,
                  pIVar1[2].element.itm,pIVar1[2].element.itm);
        }
        else {
          in_stack_ffffffffffffffb8 = (Item *)pIVar1[2].element.str;
          in_stack_ffffffffffffffc0 = pIVar1[2].element.itm;
          sprintf(buf,
                  "{int _i, _j; for (_j=%d; _j >=0; _j--) {\nfor (_i=%d; _i>0; _i--) __%s[_i][_j] = __%s[_i-1][_j];\n __%s[0][_j] = %s[_j];\n}}\n"
                  ,(ulong)(*(int *)&pIVar1[1].prev - 1),
                  (ulong)(*(int *)((long)&pIVar1[1].prev + 4) - 1),pIVar1[2].element.itm,
                  pIVar1[2].element.itm);
        }
        insertstr(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
        *(undefined4 *)&pIVar1[1].next = 0;
      }
    }
  }
  movelist(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(List *)0x111019);
  return;
}

Assistant:

void massagediscblk(q1, q2, q3, q4) /*DISCRETE NAME stmtlist '}'*/
	Item *q1, *q2, *q3, *q4;
{
	int i;
	Symbol *s;
	Item *qs;
	
	replacstr(q1, "int");
	Insertstr(q3, "()\n{\n");
	Insertstr(q4, "}\n");
	SYM(q2)->subtype |= DISCF;
	SYMITER(NAME) if (s->subtype & STAT && s->used && s->discdim) {
		if (s->subtype & ARRAY) {
Sprintf(buf, "{int _i, _j; for (_j=%d; _j >=0; _j--) {\n\
for (_i=%d; _i>0; _i--) __%s[_i][_j] = __%s[_i-1][_j];\n\
 __%s[0][_j] = %s[_j];\n\
}}\n",
			s->araydim -1,
			s->discdim -1, s->name, s->name, s->name, s->name);
		}else{
Sprintf(buf, "{int _i; for (_i=%d; _i>0; _i--) __%s[_i] = __%s[_i-1];\n\
 __%s[0] = %s;\n}\n",
			s->discdim -1, s->name, s->name, s->name, s->name);
		}
		Insertstr(q3, buf);
		s->used = 0;
	}
	/*initialization and declaration done elsewhere*/
	movelist(q1, q4, procfunc);
}